

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SimInfo::getGlobalGroupIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SimInfo *this)

{
  CutoffGroup *pCVar1;
  Molecule *pMVar2;
  pointer ppCVar3;
  MoleculeIterator mi;
  int local_3c;
  MoleculeIterator local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_38._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header)
  {
    pMVar2 = (Molecule *)0x0;
  }
  else {
    pMVar2 = (Molecule *)local_38._M_node[1]._M_parent;
  }
  while (pMVar2 != (Molecule *)0x0) {
    ppCVar3 = (pMVar2->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar3 !=
        (pMVar2->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00131c72;
    pCVar1 = (CutoffGroup *)0x0;
    while (pCVar1 != (CutoffGroup *)0x0) {
      local_3c = pCVar1->globalIndex;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_3c);
      ppCVar3 = ppCVar3 + 1;
      pCVar1 = (CutoffGroup *)0x0;
      if (ppCVar3 !=
          (pMVar2->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00131c72:
        pCVar1 = *ppCVar3;
      }
    }
    pMVar2 = nextMolecule(this,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> SimInfo::getGlobalGroupIndices() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    vector<int> GlobalGroupIndices;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      // local index of cutoff group is trivial, it only depends on the
      // order of travesing
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        GlobalGroupIndices.push_back(cg->getGlobalIndex());
      }
    }
    return GlobalGroupIndices;
  }